

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O2

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  uint _h;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  _func_int **pp_Var4;
  int *piVar5;
  pointer piVar6;
  _func_int *p_Var7;
  _func_int **pp_Var8;
  int k;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  int j;
  uint uVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  _func_int **pp_Var19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  allocator_type local_169;
  Mat local_168;
  LRN_x86 *local_120;
  ulong local_118;
  void *local_110;
  _func_int **local_108;
  ulong local_100;
  Mat local_f8;
  void *local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  long local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar10 = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  pp_Var19 = (_func_int **)(ulong)_h;
  uVar23 = bottom_top_blob->c;
  sVar1 = bottom_top_blob->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,uVar10,_h,uVar23,sVar1,opt->workspace_allocator);
  if ((local_f8.data == (void *)0x0) || (local_f8.cstep * (long)local_f8.c == 0)) {
LAB_00306a55:
    iVar9 = -100;
  }
  else {
    local_80 = (long)(int)uVar10;
    pvVar16 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    uVar22 = 0;
    iVar9 = _h * uVar10;
    if ((int)(_h * uVar10) < 1) {
      iVar9 = 0;
    }
    uVar24 = 0;
    if (0 < (int)uVar23) {
      uVar24 = (ulong)uVar23;
    }
    sVar3 = bottom_top_blob->elemsize;
    pvVar11 = local_f8.data;
    for (; uVar22 != uVar24; uVar22 = uVar22 + 1) {
      for (lVar21 = 0; iVar9 != (int)lVar21; lVar21 = lVar21 + 1) {
        fVar26 = *(float *)((long)pvVar16 + lVar21 * 4);
        *(float *)((long)pvVar11 + lVar21 * 4) = fVar26 * fVar26;
      }
      pvVar11 = (void *)((long)pvVar11 +
                        local_f8.cstep *
                        CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
      pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar3);
    }
    pp_Var8 = this->_vptr_LRN_x86;
    local_120 = this;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) == 0) {
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      Mat::create(&local_168,uVar10,_h,uVar23,sVar1,opt->workspace_allocator);
      if ((local_168.data == (void *)0x0) || (local_168.cstep * (long)local_168.c == 0)) {
        piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
LAB_00306a4d:
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_00306a55;
      }
      uVar10 = (int)local_168.cstep * local_168.c;
      uVar12 = 0;
      uVar22 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar22 = uVar12;
      }
      for (; (int)uVar22 != (int)uVar12; uVar12 = uVar12 + 1) {
        *(undefined4 *)((long)local_168.data + uVar12 * 4) = 0;
      }
      local_108 = this->_vptr_LRN_x86;
      iVar14 = *(int *)(&this->field_0xd4 + (long)local_108[-3]);
      local_100 = CONCAT44(local_100._4_4_,*(undefined4 *)(&this->field_0xd8 + (long)local_108[-3]))
      ;
      pvVar16 = bottom_top_blob->data;
      sVar1 = bottom_top_blob->cstep;
      local_110 = (void *)(local_168.cstep *
                          CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
      sVar2 = bottom_top_blob->elemsize;
      pvVar11 = local_168.data;
      local_118 = uVar24;
      for (uVar22 = 0; uVar22 != local_118; uVar22 = uVar22 + 1) {
        iVar15 = *(int *)(&this->field_0xd4 + (long)local_108[-3]);
        lVar21 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
                 * uVar22;
        for (uVar10 = iVar15 / -2 + (int)uVar22; (int)uVar10 <= iVar15 / 2 + (int)uVar22;
            uVar10 = uVar10 + 1) {
          if ((int)uVar10 < (int)uVar23 && -1 < (int)uVar10) {
            for (lVar20 = 0; iVar9 != (int)lVar20; lVar20 = lVar20 + 1) {
              *(float *)((long)local_168.data + lVar20 * 4 + lVar21) =
                   *(float *)((long)local_168.data + lVar20 * 4 + lVar21) +
                   *(float *)((long)local_f8.data +
                             lVar20 * 4 +
                             (ulong)uVar10 *
                             local_f8.cstep *
                             CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
            }
            iVar15 = *(int *)(&this->field_0xd4 + (long)local_108[-3]);
          }
        }
        pp_Var19 = this->_vptr_LRN_x86;
        for (lVar21 = 0; iVar9 != (int)lVar21; lVar21 = lVar21 + 1) {
          fVar26 = powf(*(float *)((long)pvVar11 + lVar21 * 4) * (float)local_100 *
                        (1.0 / (float)iVar14) +
                        *(float *)(&local_120->field_0xe0 + (long)pp_Var19[-3]),
                        -*(float *)(&local_120->field_0xdc + (long)pp_Var19[-3]));
          *(float *)((long)pvVar16 + lVar21 * 4) = fVar26 * *(float *)((long)pvVar16 + lVar21 * 4);
        }
        pvVar16 = (void *)((long)pvVar16 + sVar1 * sVar2);
        pvVar11 = (void *)((long)pvVar11 + (long)local_110);
        this = local_120;
      }
      piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_168.allocator == (Allocator *)0x0) goto LAB_00306a40;
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar9 = 0;
      if (*(int *)(&this->field_0xd0 + (long)pp_Var8[-3]) != 1) goto LAB_00306a58;
      piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      local_168.data = local_f8.data;
      local_168.refcount._0_4_ = local_f8.refcount._0_4_;
      local_168.refcount._4_4_ = local_f8.refcount._4_4_;
      local_168.elemsize._0_4_ = (undefined4)local_f8.elemsize;
      local_168.elemsize._4_4_ = local_f8.elemsize._4_4_;
      local_168.elempack = local_f8.elempack;
      local_168.allocator = local_f8.allocator;
      local_168.dims = local_f8.dims;
      local_168.w = local_f8.w;
      local_168.h = local_f8.h;
      local_168.d = local_f8.d;
      local_168.c = local_f8.c;
      local_168.cstep = local_f8.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
        pp_Var8 = this->_vptr_LRN_x86;
      }
      p_Var7 = pp_Var8[-3];
      uVar23 = *(uint *)(&this->field_0xd4 + (long)p_Var7);
      uVar13 = uVar10;
      if (1 < (int)uVar23) {
        uVar23 = uVar23 >> 1;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = *(pointer *)opt;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)opt->workspace_allocator;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)opt->workspace_allocator;
        iVar9 = ~uVar23 + *(int *)(&this->field_0xd4 + (long)pp_Var8[-3]);
        copy_make_border(&local_f8,&local_168,uVar23,iVar9,uVar23,iVar9,0,0.0,(Option *)&_space_ofs)
        ;
        if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0)) {
          piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_168.allocator == (Allocator *)0x0) goto LAB_00306a4d;
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
          goto LAB_00306a55;
        }
        p_Var7 = this->_vptr_LRN_x86[-3];
        uVar23 = *(uint *)(&this->field_0xd4 + (long)p_Var7);
        uVar13 = local_168.w;
      }
      uVar23 = uVar23 * uVar23;
      fVar26 = *(float *)(&this->field_0xd8 + (long)p_Var7);
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar23,&local_169);
      piVar6 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pp_Var8 = this->_vptr_LRN_x86;
      iVar9 = *(int *)(&this->field_0xd4 + (long)pp_Var8[-3]);
      iVar14 = uVar13 - iVar9;
      lVar21 = 0;
      iVar15 = 0;
      for (iVar17 = 0; iVar17 < iVar9; iVar17 = iVar17 + 1) {
        for (lVar20 = 0; iVar18 = (int)lVar20, iVar18 < iVar9; lVar20 = lVar20 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar21 + lVar20] = iVar15 + iVar18;
          iVar9 = *(int *)(&this->field_0xd4 + (long)pp_Var8[-3]);
        }
        iVar15 = iVar15 + iVar14 + iVar18;
        lVar21 = (int)lVar21 + lVar20;
      }
      local_98 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_a0 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
      ;
      local_88 = (long)local_168.w *
                 CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      local_100 = (ulong)uVar10;
      local_a8 = bottom_top_blob->data;
      if ((int)_h < 1) {
        pp_Var19 = (_func_int **)0x0;
      }
      local_b0 = local_168.data;
      uVar22 = 0;
      local_118 = uVar24;
      while (uVar22 != local_118) {
        pvVar16 = (void *)(local_98 * uVar22 + (long)local_a8);
        local_110 = (void *)(local_a0 * uVar22 + (long)local_b0);
        pp_Var8 = (_func_int **)0x0;
        local_90 = uVar22;
        while (pvVar11 = local_110, pp_Var8 != pp_Var19) {
          lVar21 = local_88 * (long)pp_Var8;
          pp_Var4 = this->_vptr_LRN_x86;
          local_108 = pp_Var8;
          for (uVar22 = 0; uVar22 != local_100; uVar22 = uVar22 + 1) {
            fVar25 = 0.0;
            for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
              fVar25 = fVar25 + *(float *)((long)pvVar11 +
                                          (long)piVar6[uVar24] * 4 + uVar22 * 4 + lVar21);
            }
            fVar25 = powf(fVar25 * fVar26 * (1.0 / (float)(int)uVar23) +
                          *(float *)(&local_120->field_0xe0 + (long)pp_Var4[-3]),
                          -*(float *)(&local_120->field_0xdc + (long)pp_Var4[-3]));
            *(float *)((long)pvVar16 + uVar22 * 4) = fVar25 * *(float *)((long)pvVar16 + uVar22 * 4)
            ;
          }
          pvVar16 = (void *)((long)pvVar16 + local_80 * 4);
          this = local_120;
          pp_Var8 = (_func_int **)((long)local_108 + 1);
        }
        uVar22 = local_90 + 1;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
      piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
LAB_00306a40:
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    iVar9 = 0;
  }
LAB_00306a58:
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        free(local_f8.data);
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}